

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O0

int run_test_pipe_overlong_path(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  char path [512];
  int64_t eval_b;
  int64_t eval_a;
  uv_connect_t req;
  uv_pipe_t pipe;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)&req.queue.prev,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xc4,"uv_pipe_init(uv_default_loop(), &pipe, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  memset(&eval_a_1,0x40,0x200);
  iVar1 = uv_pipe_bind2((uv_pipe_t *)&req.queue.prev,(char *)&eval_a_1,0x200,1);
  if ((long)iVar1 != -0x24) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xca,"UV_ENAMETOOLONG","==",
            "uv_pipe_bind2(&pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE)",0xffffffffffffffdc,"==",
            (long)iVar1);
    abort();
  }
  iVar1 = uv_pipe_connect2((uv_connect_t *)&eval_a,(uv_pipe_t *)&req.queue.prev,(char *)&eval_a_1,
                           0x200,1,abort);
  if ((long)iVar1 != -0x24) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xd1,"UV_ENAMETOOLONG","==",
            "uv_pipe_connect2(&req, &pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE, (uv_connect_cb) abort)"
            ,0xffffffffffffffdc,"==",(long)iVar1);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xd2,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_bind((uv_pipe_t *)&req.queue.prev,"");
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xd5,"UV_EINVAL","==","uv_pipe_bind(&pipe, \"\")",0xffffffffffffffea,"==",(long)iVar1);
    abort();
  }
  uv_pipe_connect((uv_connect_t *)&eval_a,(uv_pipe_t *)&req.queue.prev,"",connect_overlong_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xda,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xdc,"1","==","connect_cb_called",1,"==",(long)connect_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xdd,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0xdf,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_overlong_path) {
  uv_pipe_t pipe;
  uv_connect_t req;

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe, 0));

#ifndef _WIN32
  char path[512];
  memset(path, '@', sizeof(path));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_bind2(&pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_connect2(&req,
                             &pipe,
                             path,
                             sizeof(path),
                             UV_PIPE_NO_TRUNCATE,
                             (uv_connect_cb) abort));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
#endif

  ASSERT_EQ(UV_EINVAL, uv_pipe_bind(&pipe, ""));
  uv_pipe_connect(&req,
                  &pipe,
                  "",
                  (uv_connect_cb) connect_overlong_cb);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;

}